

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float *pfVar3;
  double *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double in_XMM0_Qa;
  double dVar10;
  double dVar11;
  ImVec2 IVar12;
  double in_XMM1_Qa;
  float in_XMM2_Da;
  double *in_stack_00000008;
  float grab_pos;
  float grab_t;
  double v_new_off_round;
  double v_new_off_floor;
  double v_new_off_f;
  float a_1;
  float a;
  double v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  double linear_dist_max_to_0;
  double linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  double v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  double in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  double local_118;
  undefined3 in_stack_fffffffffffffef4;
  uint3 uVar13;
  uint uVar14;
  undefined1 uVar15;
  ImGuiInputReadMode in_stack_fffffffffffffef8;
  ImGuiNavDirSourceFlags in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  double in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  ImGuiDataType in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float fStack_dc;
  ImVec2 local_d8;
  float local_a0;
  float local_9c;
  float fStack_98;
  float local_90;
  bool local_89;
  float local_78;
  float local_5c;
  float slow_factor;
  
  pIVar1 = GImGui;
  bVar4 = (in_R9D & 1) != 0;
  uVar14 = CONCAT13(1,in_stack_fffffffffffffef4);
  if (in_EDX != 8) {
    uVar14 = CONCAT13(in_EDX == 9,in_stack_fffffffffffffef4);
  }
  uVar15 = (undefined1)(uVar14 >> 0x18);
  uVar13 = (uint3)(ushort)uVar14;
  if ((in_XMM2_Da != 1.0) || (NAN(in_XMM2_Da))) {
    uVar13 = CONCAT12(uVar15,(ushort)uVar14);
  }
  slow_factor = (float)CONCAT13(uVar15,uVar13);
  fVar5 = ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                             ,(size_t)in_stack_fffffffffffffeb8);
  fVar6 = ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                             ,(size_t)in_stack_fffffffffffffeb8);
  fVar6 = (fVar5 - fVar6) - 4.0;
  local_5c = (pIVar1->Style).GrabMinSize;
  if (in_XMM1_Qa <= in_XMM0_Qa) {
    local_118 = in_XMM0_Qa - in_XMM1_Qa;
  }
  else {
    local_118 = in_XMM1_Qa - in_XMM0_Qa;
  }
  local_9c = in_stack_fffffffffffffec8;
  if (((uVar14 & 0x1000000) == 0) && (0.0 <= local_118)) {
    local_5c = ImMax<float>((float)((double)fVar6 / (local_118 + 1.0)),(pIVar1->Style).GrabMinSize);
    local_9c = in_stack_fffffffffffffec8;
  }
  fVar7 = ImMin<float>(local_5c,fVar6);
  fVar8 = ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                             ,(size_t)in_stack_fffffffffffffeb8);
  fVar8 = fVar7 * 0.5 + fVar8 + 2.0;
  fVar9 = ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                             ,(size_t)in_stack_fffffffffffffeb8);
  if (((uVar13 & 0x10000) == 0) || (0.0 <= in_XMM0_Qa * in_XMM1_Qa)) {
    in_stack_fffffffffffffed0 = 0;
    in_stack_fffffffffffffed4 = 1.0;
    local_78 = in_stack_fffffffffffffed4;
    if (0.0 <= in_XMM0_Qa) {
      in_stack_fffffffffffffed4 = 0.0;
      local_78 = in_stack_fffffffffffffed4;
    }
  }
  else {
    dVar10 = ImPow((double)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffeb8);
    dVar11 = ImPow((double)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffeb8);
    local_78 = (float)(dVar10 / (dVar10 + dVar11));
  }
  local_89 = false;
  if (pIVar1->ActiveId == in_ESI) {
    bVar2 = false;
    local_90 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar3 = ImVec2::operator[]((ImVec2 *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    (size_t)in_stack_fffffffffffffeb8);
        if (fVar6 - fVar7 <= 0.0) {
          in_stack_fffffffffffffecc = 0.0;
        }
        else {
          in_stack_fffffffffffffecc = ImClamp<float>((*pfVar3 - fVar8) / (fVar6 - fVar7),0.0,1.0);
        }
        local_90 = in_stack_fffffffffffffecc;
        if (bVar4) {
          local_90 = 1.0 - in_stack_fffffffffffffecc;
        }
        bVar2 = true;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar12 = GetNavInputAmount2d(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,slow_factor,
                                   fVar5);
      if (bVar4) {
        fStack_98 = IVar12.y;
        local_9c = -fStack_98;
      }
      else {
        local_9c = IVar12.x;
      }
      if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((local_9c != 0.0) || (NAN(local_9c))) {
        fVar5 = local_9c;
        local_90 = SliderCalcRatioFromValueT<double,double>
                             ((ImGuiDataType)in_stack_ffffffffffffff20,
                              (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                              in_stack_ffffffffffffff00);
        if ((uVar14 & 0x1000000) == 0) {
          in_stack_fffffffffffffec4 = 0.0;
        }
        else {
          in_stack_fffffffffffffec4 =
               (float)ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_fffffffffffffecc,fVar5),
                                 (int)in_stack_fffffffffffffec4);
        }
        if (((int)in_stack_fffffffffffffec4 < 1) && ((uVar13 & 0x10000) == 0)) {
          if (((-100.0 <= local_118) && (local_118 <= 100.0)) ||
             (bVar2 = IsNavInputDown(0xe), bVar2)) {
            local_a0 = (float)(~-(uint)(local_9c < 0.0) & 0x3f800000 |
                              -(uint)(local_9c < 0.0) & 0xbf800000) / (float)local_118;
          }
          else {
            local_a0 = local_9c / 100.0;
          }
        }
        else {
          local_a0 = local_9c / 100.0;
          bVar2 = IsNavInputDown(0xe);
          if (bVar2) {
            local_a0 = local_a0 / 10.0;
          }
        }
        bVar2 = IsNavInputDown(0xf);
        if (bVar2) {
          local_a0 = local_a0 * 10.0;
        }
        bVar2 = true;
        if (((1.0 <= local_90) && (0.0 < local_a0)) || ((local_90 <= 0.0 && (local_a0 < 0.0)))) {
          bVar2 = false;
          local_9c = fVar5;
        }
        else {
          local_90 = ImSaturate(local_90 + local_a0);
          local_9c = fVar5;
        }
      }
    }
    if (bVar2) {
      if ((uVar13 & 0x10000) == 0) {
        if ((uVar14 & 0x1000000) != 0) {
          ImLerp<double>(in_XMM0_Qa,in_XMM1_Qa,local_90);
        }
      }
      else if (local_78 <= local_90) {
        fVar5 = ImPow(0.0,4.25575e-39);
        dVar10 = ImMax<double>(in_XMM0_Qa,0.0);
        ImLerp<double>(dVar10,in_XMM1_Qa,fVar5);
      }
      else {
        fVar5 = ImPow(0.0,4.255472e-39);
        dVar10 = ImMin<double>(in_XMM1_Qa,0.0);
        ImLerp<double>(dVar10,in_XMM0_Qa,fVar5);
      }
      dVar10 = RoundScalarWithFormatT<double,double>
                         ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
      if ((*in_RCX != dVar10) || (NAN(*in_RCX) || NAN(dVar10))) {
        *in_RCX = dVar10;
        local_89 = true;
      }
    }
  }
  if (1.0 <= fVar6) {
    fVar5 = SliderCalcRatioFromValueT<double,double>
                      ((ImGuiDataType)in_stack_ffffffffffffff20,
                       (double)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                      );
    if (bVar4) {
      fVar5 = 1.0 - fVar5;
    }
    ImLerp<float>(fVar8,-fVar7 * 0.5 + (fVar9 - 2.0),fVar5);
    if (bVar4) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,local_9c,in_stack_fffffffffffffec4,
                     in_stack_fffffffffffffec0);
      *in_stack_00000008 = (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
      in_stack_00000008[1] = (double)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffecc,local_9c,in_stack_fffffffffffffec4,
                     in_stack_fffffffffffffec0);
      *in_stack_00000008 = in_stack_ffffffffffffff08;
      in_stack_00000008[1] = (double)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    }
  }
  else {
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff20,in_RDI,in_RDI);
    *in_stack_00000008 = (double)CONCAT44(fStack_dc,in_stack_ffffffffffffff20);
    *(ImVec2 *)(in_stack_00000008 + 1) = local_d8;
  }
  return local_89;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}